

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst.c
# Opt level: O0

int count_sgrproj_bits(SgrprojInfo *sgrproj_info,SgrprojInfo *ref_sgrproj_info)

{
  int iVar1;
  int *in_RDI;
  sgr_params_type *params;
  int bits;
  sgr_params_type *psVar2;
  int local_14;
  
  local_14 = 4;
  psVar2 = av1_sgr_params + *in_RDI;
  if (0 < psVar2->r[0]) {
    local_14 = aom_count_primitive_refsubexpfin
                         ((uint16_t)((ulong)psVar2 >> 0x30),(uint16_t)((ulong)psVar2 >> 0x20),
                          (uint16_t)((ulong)psVar2 >> 0x10),(uint16_t)psVar2);
    local_14 = local_14 + 4;
  }
  if (0 < psVar2->r[1]) {
    iVar1 = aom_count_primitive_refsubexpfin
                      ((uint16_t)((ulong)psVar2 >> 0x30),(uint16_t)((ulong)psVar2 >> 0x20),
                       (uint16_t)((ulong)psVar2 >> 0x10),(uint16_t)psVar2);
    local_14 = iVar1 + local_14;
  }
  return local_14;
}

Assistant:

static int count_sgrproj_bits(SgrprojInfo *sgrproj_info,
                              SgrprojInfo *ref_sgrproj_info) {
  int bits = SGRPROJ_PARAMS_BITS;
  const sgr_params_type *params = &av1_sgr_params[sgrproj_info->ep];
  if (params->r[0] > 0)
    bits += aom_count_primitive_refsubexpfin(
        SGRPROJ_PRJ_MAX0 - SGRPROJ_PRJ_MIN0 + 1, SGRPROJ_PRJ_SUBEXP_K,
        ref_sgrproj_info->xqd[0] - SGRPROJ_PRJ_MIN0,
        sgrproj_info->xqd[0] - SGRPROJ_PRJ_MIN0);
  if (params->r[1] > 0)
    bits += aom_count_primitive_refsubexpfin(
        SGRPROJ_PRJ_MAX1 - SGRPROJ_PRJ_MIN1 + 1, SGRPROJ_PRJ_SUBEXP_K,
        ref_sgrproj_info->xqd[1] - SGRPROJ_PRJ_MIN1,
        sgrproj_info->xqd[1] - SGRPROJ_PRJ_MIN1);
  return bits;
}